

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68020_bftst(void)

{
  char *pcVar1;
  char local_12 [3];
  char local_f [3];
  undefined1 auStack_c [2];
  char width [3];
  char offset [3];
  uint extension;
  
  if ((g_cpu_type & 0x1c) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    _auStack_c = dasm_read_imm_16(2);
    if ((_auStack_c & 0x800) == 0) {
      sprintf(local_f,"%d",(ulong)(_auStack_c >> 6 & 0x1f));
    }
    else {
      sprintf(local_f,"D%d",(ulong)(_auStack_c >> 6 & 7));
    }
    if ((_auStack_c & 0x20) == 0) {
      sprintf(local_12,"%d",(ulong)g_5bit_data_table[_auStack_c & 0x1f]);
    }
    else {
      sprintf(local_12,"D%d",(ulong)(_auStack_c & 7));
    }
    pcVar1 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"bftst   %s {%s:%s}; (2+)",pcVar1,local_f,local_12);
  }
  return;
}

Assistant:

static void d68020_bftst(void)
{
	uint extension;
	char offset[3];
	char width[3];

	LIMIT_CPU_TYPES(M68020_PLUS);

	extension = read_imm_16();

	if(BIT_B(extension))
		sprintf(offset, "D%d", (extension>>6)&7);
	else
		sprintf(offset, "%d", (extension>>6)&31);
	if(BIT_5(extension))
		sprintf(width, "D%d", extension&7);
	else
		sprintf(width, "%d", g_5bit_data_table[extension&31]);
	sprintf(g_dasm_str, "bftst   %s {%s:%s}; (2+)", get_ea_mode_str_8(g_cpu_ir), offset, width);
}